

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

wstring * __thiscall
PDA::Transducer::Register::toString_abi_cxx11_(wstring *__return_storage_ptr__,Register *this)

{
  ulong uVar1;
  wstring local_d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  undefined1 local_19;
  Register *local_18;
  Register *this_local;
  wstring *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Register *)__return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  if ((this->integer & 1U) != 0) {
    switch(this->argumentIndex) {
    case 0:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"rdi");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"edi");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"di");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"dil");
      }
      break;
    case 1:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"rsi");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"esi");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"si");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"sil");
      }
      break;
    case 2:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"rdx");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"edx");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"dx");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"dl");
      }
      break;
    case 3:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"rcx");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"ecx");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"cx");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"cl");
      }
      break;
    case 4:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"r8");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"r8d");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"r8w");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"r8b");
      }
      break;
    case 5:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"r9");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"r9d");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"r9w");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"r9b");
      }
      break;
    case 0x50:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"rax");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"eax");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"ax");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"al");
      }
      break;
    case 0x51:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"rbp");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"ebp");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"bp");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"bpl");
      }
      break;
    case 0x52:
      switch(this->size) {
      case Full:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"rsp");
        break;
      case Half:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"esp");
        break;
      case Quarter:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"sp");
        break;
      case OneEight:
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,L"spl");
      }
    }
  }
  uVar1 = std::__cxx11::wstring::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_50,L'%',__return_storage_ptr__);
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_50);
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
    if ((this->isPtr & 1U) != 0) {
      std::operator+(&local_90,L'(',__return_storage_ptr__);
      std::operator+(&local_70,&local_90,L')');
      std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_70);
      std::__cxx11::wstring::~wstring((wstring *)&local_70);
      std::__cxx11::wstring::~wstring((wstring *)&local_90);
      if (this->ptrOffset != 0) {
        std::__cxx11::to_wstring(&local_d0,this->ptrOffset);
        std::operator+(&local_b0,&local_d0,__return_storage_ptr__);
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_b0);
        std::__cxx11::wstring::~wstring((wstring *)&local_b0);
        std::__cxx11::wstring::~wstring((wstring *)&local_d0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Register::toString() const
{
    // rdi rsi rdx rcx r8 r9 || xmm0-7
    std::wstring result;
    if (integer)
    {
        switch(argumentIndex)
        {
        case ReturnType:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rax";
                break; case Size::Half:
                result = L"eax";
                break; case Size::Quarter:
                result = L"ax";
                break; case Size::OneEight:
                result = L"al";
            }
            break;
        }
        case StackBase:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rbp";
                break; case Size::Half:
                result = L"ebp";
                break; case Size::Quarter:
                result = L"bp";
                break; case Size::OneEight:
                result = L"bpl";
            }
            break;
        }
        case StackTop:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rsp";
                break; case Size::Half:
                result = L"esp";
                break; case Size::Quarter:
                result = L"sp";
                break; case Size::OneEight:
                result = L"spl";
            }
            break;
        }
        case 0:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rdi";
                break; case Size::Half:
                result = L"edi";
                break; case Size::Quarter:
                result = L"di";
                break; case Size::OneEight:
                result = L"dil";
            }
            break;
        }
        case 1:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rsi";
                break; case Size::Half:
                result = L"esi";
                break; case Size::Quarter:
                result = L"si";
                break; case Size::OneEight:
                result = L"sil";
            }
            break;
        }
        case 2:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rdx";
                break; case Size::Half:
                result = L"edx";
                break; case Size::Quarter:
                result = L"dx";
                break; case Size::OneEight:
                result = L"dl";
            }
            break;
        }
        case 3:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rcx";
                break; case Size::Half:
                result = L"ecx";
                break; case Size::Quarter:
                result = L"cx";
                break; case Size::OneEight:
                result = L"cl";
            }
            break;
        }
        case 4:
        {
            switch(size)
            {
            case Size::Full:
                result = L"r8";
                break; case Size::Half:
                result = L"r8d";
                break; case Size::Quarter:
                result = L"r8w";
                break; case Size::OneEight:
                result = L"r8b";
            }
            break;
        }
        case 5:
        {
            switch(size)
            {
            case Size::Full:
                result = L"r9";
                break; case Size::Half:
                result = L"r9d";
                break; case Size::Quarter:
                result = L"r9w";
                break; case Size::OneEight:
                result = L"r9b";
            }
            break;
        }
        }
    }

    if (!result.empty())
    {
        result = L'%' + result;
        if (isPtr)
        {
            result = L'(' + result + L')';
            if (ptrOffset != 0)
                result = std::to_wstring(ptrOffset) + result;
        }
    }

    return result;
}